

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  byte *from;
  PointerReader other;
  StructReader other_00;
  bool bVar1;
  WiderType<Decay<unsigned_short_&>,_Decay<const_unsigned_short_&>_> WVar2;
  ListElementCount LVar3;
  size_t sVar4;
  ListReader *pLVar5;
  WiderType<Decay<unsigned_short_&>,_Decay<unsigned_long>_> WVar6;
  WirePointer *pWVar7;
  uint *puVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  word *pwVar11;
  unsigned_long count;
  ListReader *list_4;
  ListReader *__end3_3;
  ListReader *__begin3_3;
  ArrayPtr<const_capnp::_::ListReader> *__range3_3;
  CapTableBuilder *pCStack_220;
  uint step;
  byte *target;
  Iterator local_210;
  uint i_2;
  Iterator __end4_2;
  Iterator __begin4_2;
  Range<unsigned_int> *__range4_2;
  ListReader *list_3;
  ListReader *__end3_2;
  ListReader *__begin3_2;
  ArrayPtr<const_capnp::_::ListReader> *__range3_2;
  undefined1 auStack_1d0 [4];
  ListElementCount pos_2;
  CapTableReader *pCStack_1c8;
  WirePointer *local_1c0;
  int iStack_1b8;
  undefined4 uStack_1b4;
  PointerBuilder local_1b0;
  ElementCount local_194;
  Iterator local_190;
  uint i_1;
  Iterator __end4_1;
  Iterator __begin4_1;
  Range<unsigned_int> *__range4_1;
  ListReader *list_2;
  ListReader *__end3_1;
  ListReader *__begin3_1;
  ArrayPtr<const_capnp::_::ListReader> *__range3_1;
  undefined1 auStack_150 [4];
  ListElementCount pos_1;
  CapTableReader *pCStack_148;
  void *local_140;
  WirePointer *pWStack_138;
  StructDataBitCount local_130;
  StructPointerCount SStack_12c;
  undefined2 uStack_12a;
  int iStack_128;
  undefined4 uStack_124;
  StructBuilder local_120;
  ElementCount local_f4;
  Iterator local_f0;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_int> *__range4;
  ListReader *list_1;
  ListReader *__end3;
  ListReader *__begin3;
  ArrayPtr<const_capnp::_::ListReader> *__range3;
  ListElementCount pos;
  ListBuilder builder;
  WordCount64 local_80;
  Fault local_78;
  Fault f_1;
  ListReader *list;
  ListReader *__end2;
  ListReader *__begin2;
  ArrayPtr<const_capnp::_::ListReader> *__range2;
  ListElementCount elementCount;
  Fault local_38;
  Fault f;
  ElementSize elementSize_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  OrphanBuilder *pOStack_10;
  StructSize structSize_local;
  OrphanBuilder *result;
  
  f.exception._7_1_ = elementSize;
  arena_local._4_4_ = structSize;
  pOStack_10 = __return_storage_ptr__;
  sVar4 = kj::ArrayPtr<const_capnp::_::ListReader>::size(&lists);
  if (sVar4 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd5a,FAILED,"lists.size() > 0","\"Can\'t concat empty list \"",
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  __range2._0_4_ = 0;
  __end2 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
  pLVar5 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
  do {
    if (__end2 == pLVar5) {
      builder._39_1_ = 0;
      OrphanBuilder(__return_storage_ptr__);
      if (f.exception._7_1_ == INLINE_COMPOSITE) {
        pWVar7 = tagAsPtr(__return_storage_ptr__);
        WireHelpers::initStructListPointer
                  ((ListBuilder *)&pos,pWVar7,(SegmentBuilder *)0x0,capTable,(uint)__range2,
                   arena_local._4_4_,arena);
      }
      else {
        pWVar7 = tagAsPtr(__return_storage_ptr__);
        WireHelpers::initListPointer
                  ((ListBuilder *)&pos,pWVar7,(SegmentBuilder *)0x0,capTable,(uint)__range2,
                   f.exception._7_1_,arena);
      }
      if (f.exception._7_1_ == BIT) {
        __range3_2._4_4_ = 0;
        __end3_2 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar5 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3_2 != pLVar5; __end3_2 = __end3_2 + 1) {
          LVar3 = ListReader::size(__end3_2);
          ___end4_2 = kj::zeroTo<unsigned_int>(LVar3);
          i_2 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4_2);
          local_210 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4_2);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_2,&local_210),
                bVar1) {
            puVar8 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_2);
            bVar1 = ListReader::getDataElement<bool>(__end3_2,*puVar8);
            ListBuilder::setDataElement<bool>((ListBuilder *)&pos,__range3_2._4_4_,bVar1);
            __range3_2._4_4_ = assumeBits<29u,unsigned_int>(__range3_2._4_4_ + 1);
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_2);
          }
        }
      }
      else if (f.exception._7_1_ == POINTER) {
        __range3_1._4_4_ = 0;
        __end3_1 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar5 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3_1 != pLVar5; __end3_1 = __end3_1 + 1) {
          LVar3 = ListReader::size(__end3_1);
          ___end4_1 = kj::zeroTo<unsigned_int>(LVar3);
          i_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4_1);
          local_190 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4_1);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_1,&local_190),
                bVar1) {
            puVar8 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
            local_194 = *puVar8;
            ListBuilder::getPointerElement(&local_1b0,(ListBuilder *)&pos,__range3_1._4_4_);
            ListReader::getPointerElement((PointerReader *)auStack_1d0,__end3_1,local_194);
            other.capTable = pCStack_1c8;
            other.segment = _auStack_1d0;
            other.pointer = local_1c0;
            other.nestingLimit = iStack_1b8;
            other._28_4_ = uStack_1b4;
            PointerBuilder::copyFrom(&local_1b0,other,false);
            __range3_1._4_4_ = assumeBits<29u,unsigned_int>(__range3_1._4_4_ + 1);
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
          }
        }
      }
      else if (f.exception._7_1_ == INLINE_COMPOSITE) {
        __range3._0_4_ = 0;
        __end3 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar5 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3 != pLVar5; __end3 = __end3 + 1) {
          LVar3 = ListReader::size(__end3);
          ___end4 = kj::zeroTo<unsigned_int>(LVar3);
          i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end4);
          local_f0 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end4);
          while (bVar1 = kj::Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_f0),
                bVar1) {
            puVar8 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
            local_f4 = *puVar8;
            ListBuilder::getStructElement(&local_120,(ListBuilder *)&pos,(uint)__range3);
            ListReader::getStructElement((StructReader *)auStack_150,__end3,local_f4);
            other_00.capTable = pCStack_148;
            other_00.segment = _auStack_150;
            other_00.data = local_140;
            other_00.pointers = pWStack_138;
            other_00.dataSize = local_130;
            other_00.pointerCount = SStack_12c;
            other_00._38_2_ = uStack_12a;
            other_00.nestingLimit = iStack_128;
            other_00._44_4_ = uStack_124;
            StructBuilder::copyContentFrom(&local_120,other_00);
            __range3._0_4_ = assumeBits<29u,unsigned_int>((uint)__range3 + 1);
            kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
          }
        }
      }
      else {
        pCStack_220 = builder.capTable;
        __end3_3 = kj::ArrayPtr<const_capnp::_::ListReader>::begin(&lists);
        pLVar5 = kj::ArrayPtr<const_capnp::_::ListReader>::end(&lists);
        for (; __end3_3 != pLVar5; __end3_3 = __end3_3 + 1) {
          LVar3 = ListReader::size(__end3_3);
          uVar9 = upgradeBound<unsigned_long,unsigned_int>(LVar3);
          uVar9 = (builder.ptr._4_4_ >> 3) * uVar9;
          from = __end3_3->ptr;
          uVar10 = assumeBits<29u,unsigned_long>(uVar9);
          WireHelpers::copyMemory((byte *)pCStack_220,from,(ByteCount32)uVar10);
          pCStack_220 = (CapTableBuilder *)((long)&pCStack_220->super_CapTableReader + uVar9);
        }
      }
      __return_storage_ptr__->segment = _pos;
      __return_storage_ptr__->capTable = capTable;
      pwVar11 = ListBuilder::getLocation((ListBuilder *)&pos);
      __return_storage_ptr__->location = pwVar11;
      return __return_storage_ptr__;
    }
    __range2._0_4_ =
         assertMaxBits<29u,unsigned_int,capnp::_::OrphanBuilder::concat(capnp::_::BuilderArena*,capnp::_::CapTableBuilder*,capnp::ElementSize,capnp::_::StructSize,kj::ArrayPtr<capnp::_::ListReader_const>)::__0>
                   ((uint)__range2 + __end2->elementCount,
                    (anon_class_1_0_00000001 *)((long)&f_1.exception + 7));
    if (__end2->elementSize != f.exception._7_1_) {
      if (__end2->elementSize == BIT || f.exception._7_1_ == BIT) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                  (&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xd64,FAILED,
                   "list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT",
                   "\"can\'t upgrade bit lists to struct lists\"",
                   (char (*) [40])"can\'t upgrade bit lists to struct lists");
        kj::_::Debug::Fault::fatal(&local_78);
      }
      f.exception._7_1_ = INLINE_COMPOSITE;
    }
    local_80 = WireHelpers::roundBitsUpToWords((ulong)__end2->structDataSize);
    WVar6 = kj::max<unsigned_short&,unsigned_long>
                      ((unsigned_short *)((long)&arena_local + 4),&local_80);
    arena_local._4_4_ = (StructSize)CONCAT22(arena_local._6_2_,(short)WVar6);
    WVar2 = kj::max<unsigned_short&,unsigned_short_const&>
                      ((unsigned_short *)((long)&arena_local + 6),&__end2->structPointerCount);
    arena_local._4_4_ = (StructSize)CONCAT22(WVar2,arena_local._4_2_);
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}